

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

void Sbl_ManStop(Sbl_Man_t *p)

{
  Vec_Int_t *pVVar1;
  Hsh_VecMan_t *__ptr;
  Vec_Wec_t *__ptr_00;
  void *__ptr_01;
  Vec_Wrd_t *pVVar2;
  long lVar3;
  long lVar4;
  
  sat_solver_delete(p->pSat);
  pVVar1 = p->vCardVars;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vLeaves;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vAnds;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vNodes;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vRoots;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vRootVars;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  __ptr = p->pHash;
  pVVar1 = __ptr->vTable;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = __ptr->vData;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = __ptr->vMap;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  free(__ptr);
  pVVar1 = p->vArrs;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vReqs;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  __ptr_00 = p->vWindow;
  if (0 < __ptr_00->nCap) {
    lVar4 = 8;
    lVar3 = 0;
    do {
      __ptr_01 = *(void **)((long)&__ptr_00->pArray->nCap + lVar4);
      if (__ptr_01 != (void *)0x0) {
        free(__ptr_01);
        *(undefined8 *)((long)&__ptr_00->pArray->nCap + lVar4) = 0;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < __ptr_00->nCap);
  }
  if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (Vec_Int_t *)0x0;
  }
  __ptr_00->nCap = 0;
  __ptr_00->nSize = 0;
  free(__ptr_00);
  pVVar1 = p->vPath;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vEdges;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar2 = p->vCutsI1;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCutsI2;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCutsN1;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCutsN2;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar1 = p->vCutsNum;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vCutsStart;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vCutsObj;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vSolInit;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vSolCur;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vSolBest;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar2 = p->vTempI1;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vTempI2;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vTempN1;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vTempN2;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar1 = p->vLits;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vAssump;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vPolar;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  free(p);
  return;
}

Assistant:

void Sbl_ManStop( Sbl_Man_t * p )
{
    sat_solver_delete( p->pSat );
    Vec_IntFree( p->vCardVars );
    // internal
    Vec_IntFree( p->vLeaves );
    Vec_IntFree( p->vAnds );
    Vec_IntFree( p->vNodes );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vRootVars );
    Hsh_VecManStop( p->pHash );
    // timing
    Vec_IntFree( p->vArrs );
    Vec_IntFree( p->vReqs );
    Vec_WecFree( p->vWindow );
    Vec_IntFree( p->vPath );
    Vec_IntFree( p->vEdges );
    // cuts
    Vec_WrdFree( p->vCutsI1 );
    Vec_WrdFree( p->vCutsI2 );
    Vec_WrdFree( p->vCutsN1 );
    Vec_WrdFree( p->vCutsN2 );
    Vec_IntFree( p->vCutsNum );
    Vec_IntFree( p->vCutsStart );
    Vec_IntFree( p->vCutsObj );
    Vec_IntFree( p->vSolInit );
    Vec_IntFree( p->vSolCur );
    Vec_IntFree( p->vSolBest );
    Vec_WrdFree( p->vTempI1 );
    Vec_WrdFree( p->vTempI2 );
    Vec_WrdFree( p->vTempN1 );
    Vec_WrdFree( p->vTempN2 );
    // temporary
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vAssump );
    Vec_IntFree( p->vPolar );
    // other
    ABC_FREE( p );
}